

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void __thiscall phosg::InverseTerminalGuard::~InverseTerminalGuard(InverseTerminalGuard *this)

{
  string e;
  
  if (this->active == true) {
    format_color_escape_abi_cxx11_(&e,NORMAL,0xffffffffffffffff);
    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
              (&this->write_data,e._M_dataplus._M_p,e._M_string_length);
    ::std::__cxx11::string::~string((string *)&e);
  }
  ::std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

~InverseTerminalGuard() {
    if (this->active) {
      string e = format_color_escape(TerminalFormat::NORMAL, TerminalFormat::END);
      this->write_data(e.data(), e.size());
    }
  }